

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O1

void add_page(QPDFPageDocumentHelper *dh,QPDFObjectHandle *font,string *color_space,string *filter)

{
  pointer pcVar1;
  QPDFPageObjectHelper QVar2;
  ImageProvider *this;
  long *plVar3;
  size_type *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle QVar7;
  string contents_1;
  QPDFObjectHandle page;
  QPDFObjectHandle resources;
  QPDFObjectHandle image_dict;
  QPDFObjectHandle image;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  QPDFObjectHandle xobject;
  QPDFObjectHandle rfont;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> provider;
  QPDFObjectHandle contents;
  QPDFObjectHandle procset;
  element_type *peVar8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  long in_stack_fffffffffffffe68;
  long lVar11;
  long in_stack_fffffffffffffe70;
  _Alloc_hider in_stack_fffffffffffffe78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  string local_168 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  string local_158 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  QPDFObjectHandle local_128;
  element_type local_118 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  long *local_108 [2];
  long local_f8 [2];
  string local_e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  string local_d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  ImageProvider *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  ImageProvider *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  QPDFPageDocumentHelper *local_a8;
  QPDFObjectHandle *local_a0;
  char local_98 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  string local_88 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  char local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  QPDFPageObjectHelper local_68;
  
  _Var5._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&dh->field_0x8;
  local_a8 = dh;
  local_a0 = font;
  this = (ImageProvider *)operator_new(0x88);
  ImageProvider::ImageProvider(this,color_space,filter);
  local_b8 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ImageProvider*>(&local_b0,this);
  QPDF::newStream();
  operator____qpdf((char *)local_158,0x10a092);
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe58,"/ColorSpace","");
  QPDFObjectHandle::newName((string *)&stack0xfffffffffffffe78);
  QPDFObjectHandle::replaceKey(local_158,(QPDFObjectHandle *)&stack0xfffffffffffffe58);
  if (in_stack_fffffffffffffe80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffe80);
  }
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,in_stack_fffffffffffffe68 + 1);
  }
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe58,"/Width","");
  newInteger((size_t)&stack0xfffffffffffffe78);
  QPDFObjectHandle::replaceKey(local_158,(QPDFObjectHandle *)&stack0xfffffffffffffe58);
  if (in_stack_fffffffffffffe80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffe80);
  }
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,in_stack_fffffffffffffe68 + 1);
  }
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe58,"/Height","");
  newInteger((size_t)&stack0xfffffffffffffe78);
  QPDFObjectHandle::replaceKey(local_158,(QPDFObjectHandle *)&stack0xfffffffffffffe58);
  if (in_stack_fffffffffffffe80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffe80);
  }
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,in_stack_fffffffffffffe68 + 1);
  }
  QPDFObjectHandle::replaceDict(&local_128);
  local_c8 = local_b8;
  local_c0 = local_b0._M_pi;
  if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b0._M_pi)->_M_use_count = (local_b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b0._M_pi)->_M_use_count = (local_b0._M_pi)->_M_use_count + 1;
    }
  }
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe58,"");
  QPDFObjectHandle::parse((string *)&stack0xfffffffffffffe78,(string *)filter);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData(&local_128,&local_c8,&stack0xfffffffffffffe78,&local_148);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_string_length);
  }
  if (in_stack_fffffffffffffe80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffe80);
  }
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,in_stack_fffffffffffffe68 + 1);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  operator____qpdf(local_78,0x10a0e5);
  QPDFObjectHandle::newDictionary();
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe58,"/F1","");
  QPDFObjectHandle::replaceKey(local_d8,(QPDFObjectHandle *)&stack0xfffffffffffffe58);
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,in_stack_fffffffffffffe68 + 1);
  }
  QPDFObjectHandle::newDictionary();
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe58,"/Im1","");
  QPDFObjectHandle::replaceKey(local_e8,(QPDFObjectHandle *)&stack0xfffffffffffffe58);
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,in_stack_fffffffffffffe68 + 1);
  }
  QPDFObjectHandle::newDictionary();
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe58,"/ProcSet","");
  QPDFObjectHandle::replaceKey(local_168,(QPDFObjectHandle *)&stack0xfffffffffffffe58);
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,in_stack_fffffffffffffe68 + 1);
  }
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe58,"/Font","");
  QPDFObjectHandle::replaceKey(local_168,(QPDFObjectHandle *)&stack0xfffffffffffffe58);
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,in_stack_fffffffffffffe68 + 1);
  }
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe58,"/XObject","");
  QPDFObjectHandle::replaceKey(local_168,(QPDFObjectHandle *)&stack0xfffffffffffffe58);
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,in_stack_fffffffffffffe68 + 1);
  }
  pcVar1 = (color_space->_M_dataplus)._M_p;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,pcVar1,pcVar1 + color_space->_M_string_length);
  std::__cxx11::string::append((char *)local_108);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_108,(ulong)(filter->_M_dataplus)._M_p);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_148.field_2._M_allocated_capacity = *psVar4;
    local_148.field_2._8_8_ = plVar3[3];
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar4;
    local_148._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_148._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffe78,"BT /F1 24 Tf 72 320 Td (",&local_148);
  plVar3 = (long *)std::__cxx11::string::append(&stack0xfffffffffffffe78);
  peVar8 = (element_type *)(plVar3 + 2);
  if ((element_type *)*plVar3 == peVar8) {
    lVar11 = *(long *)peVar8;
    in_stack_fffffffffffffe70 = plVar3[3];
    peVar9 = (element_type *)&stack0xfffffffffffffe68;
  }
  else {
    lVar11 = *(long *)peVar8;
    peVar9 = (element_type *)*plVar3;
  }
  _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
  *plVar3 = (long)peVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (in_stack_fffffffffffffe78._M_p != &stack0xfffffffffffffe88) {
    operator_delete(in_stack_fffffffffffffe78._M_p,(ulong)(in_stack_fffffffffffffe88 + 1));
  }
  QPDF::newStream(local_88);
  if (peVar9 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar9,lVar11 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  operator____qpdf(local_98,0x10a129);
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xfffffffffffffe78;
  QPDF::makeIndirectObject(QVar6);
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe58,"/Contents","")
  ;
  QPDFObjectHandle::replaceKey
            ((string *)&stack0xfffffffffffffe78,(QPDFObjectHandle *)&stack0xfffffffffffffe58);
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,lVar11 + 1);
  }
  peVar8 = (element_type *)&stack0xfffffffffffffe68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe58,"/Resources","");
  QPDFObjectHandle::replaceKey
            ((string *)&stack0xfffffffffffffe78,(QPDFObjectHandle *)&stack0xfffffffffffffe58);
  _Var5._M_pi = extraout_RDX;
  if (peVar8 != (element_type *)&stack0xfffffffffffffe68) {
    operator_delete(peVar8,lVar11 + 1);
    _Var5._M_pi = extraout_RDX_00;
  }
  if (in_stack_fffffffffffffe80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      in_stack_fffffffffffffe80->_M_use_count = in_stack_fffffffffffffe80->_M_use_count + 1;
      UNLOCK();
    }
    else {
      in_stack_fffffffffffffe80->_M_use_count = in_stack_fffffffffffffe80->_M_use_count + 1;
    }
  }
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_118;
  local_110 = in_stack_fffffffffffffe80;
  QPDFPageObjectHelper::QPDFPageObjectHelper(&local_68,QVar7);
  QVar2._8_8_ = _Var10._M_pi;
  QVar2._0_8_ = peVar8;
  QVar2._16_8_ = lVar11;
  QVar2._24_8_ = in_stack_fffffffffffffe70;
  QVar2._32_8_ = in_stack_fffffffffffffe78._M_p;
  QVar2.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_fffffffffffffe80;
  QVar2.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffe88;
  QPDFPageDocumentHelper::addPage(QVar2,SUB81(local_a8,0));
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_68);
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if (in_stack_fffffffffffffe80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(in_stack_fffffffffffffe80);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
  }
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_128.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
  }
  return;
}

Assistant:

void
add_page(
    QPDFPageDocumentHelper& dh,
    QPDFObjectHandle font,
    std::string const& color_space,
    std::string const& filter)
{
    QPDF& pdf(dh.getQPDF());

    // Create a stream to encode our image. QPDFWriter will fill in the length and will respect our
    // filters based on stream data mode. Since we are not specifying, QPDFWriter will compress with
    // /FlateDecode if we don't provide any other form of compression.
    auto* p = new ImageProvider(color_space, filter);
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> provider(p);
    size_t width = p->getWidth();
    size_t height = p->getHeight();
    QPDFObjectHandle image = pdf.newStream();
    auto image_dict =
        // line-break
        "<<"
        " /Type /XObject"
        " /Subtype /Image"
        " /BitsPerComponent 8"
        ">>"_qpdf;
    image_dict.replaceKey("/ColorSpace", newName(color_space));
    image_dict.replaceKey("/Width", newInteger(width));
    image_dict.replaceKey("/Height", newInteger(height));
    image.replaceDict(image_dict);

    // Provide the stream data.
    image.replaceStreamData(provider, QPDFObjectHandle::parse(filter), QPDFObjectHandle::newNull());

    // Create direct objects as needed by the page dictionary.
    QPDFObjectHandle procset = "[/PDF /Text /ImageC]"_qpdf;

    QPDFObjectHandle rfont = QPDFObjectHandle::newDictionary();
    rfont.replaceKey("/F1", font);

    QPDFObjectHandle xobject = QPDFObjectHandle::newDictionary();
    xobject.replaceKey("/Im1", image);

    QPDFObjectHandle resources = QPDFObjectHandle::newDictionary();
    resources.replaceKey("/ProcSet", procset);
    resources.replaceKey("/Font", rfont);
    resources.replaceKey("/XObject", xobject);

    // Create the page content stream
    QPDFObjectHandle contents = createPageContents(pdf, color_space + " with filter " + filter);

    // Create the page dictionary
    QPDFObjectHandle page = pdf.makeIndirectObject(
        "<<"
        " /Type /Page"
        " /MediaBox [0 0 612 392]"
        ">>"_qpdf);
    page.replaceKey("/Contents", contents);
    page.replaceKey("/Resources", resources);

    // Add the page to the PDF file
    dh.addPage(page, false);
}